

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functions.c
# Opt level: O2

double Jupiter_strtod_nospace_s(char *str,size_t length)

{
  long lVar1;
  long lVar2;
  size_t length_00;
  int iVar3;
  byte bVar4;
  double dVar5;
  double dVar6;
  
  if (length == 0) {
    dVar5 = 0.0;
  }
  else {
    if (*str == '+') {
      str = str + 1;
      length = length - 1;
    }
    else if (*str == '-') {
      dVar5 = Jupiter_strtod_nospace_s(str + 1,length - 1);
      return -dVar5;
    }
    dVar5 = 0.0;
    lVar2 = 0;
    while( true ) {
      bVar4 = str[lVar2];
      if ((ulong)bVar4 - 0x3a < 0xfffffffffffffff6) break;
      dVar5 = dVar5 * 10.0 +
              (double)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                      [bVar4];
      if (length - 1 == lVar2) {
        return dVar5;
      }
      lVar2 = lVar2 + 1;
    }
    if (bVar4 == 0x2e) {
      lVar1 = length - 1;
      iVar3 = 10;
      for (; length - 1 != lVar2; lVar2 = lVar2 + 1) {
        bVar4 = str[lVar2 + 1];
        if ((ulong)bVar4 - 0x3a < 0xfffffffffffffff6) {
          length_00 = (length - lVar2) - 2;
          lVar1 = lVar2;
          goto LAB_00139196;
        }
        dVar5 = dVar5 + (double)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                                [bVar4] / (double)iVar3;
        if (length - 2 == lVar2) {
          return dVar5;
        }
        iVar3 = iVar3 * 10;
      }
      bVar4 = str[length];
      length_00 = 0xffffffffffffffff;
LAB_00139196:
      if ((bVar4 | 0x20) == 0x65) {
        iVar3 = Jupiter_strtoi_nospace_s(str + lVar1 + 2,length_00,10);
        dVar6 = pow(10.0,(double)iVar3);
        dVar5 = dVar5 * dVar6;
      }
    }
  }
  return dVar5;
}

Assistant:

double Jupiter_strtod_nospace_s(const char *str, size_t length)
{
	const int base = 10;
	double total = 0.0;
	double decimal = 0.0;
	int tval;

	if (length == 0)
		return 0;

	if (*str == '-')
		return -1 * Jupiter_strtod_nospace_s(++str, --length);

	if (*str == '+')
		++str, --length;

	while ((tval = Jupiter_getBase(*str, base)) != -1)
	{
		total = base * total + tval;
		if (--length == 0)
			return total;
		++str;
	}

	if (*str == '.')
	{
		++str;
		--length;

		tval = base;
		while (length != 0 && (decimal = Jupiter_getBase(*str, base)) != -1)
		{
			total = total + (decimal / tval);
			if (--length == 0)
				return total;
			++str;
			tval = tval * base;
		}
		if (*str == 'e' || *str == 'E')
			total = total * pow(base, Jupiter_strtoi_nospace_s(++str, --length, 10));
	}

	return total;
}